

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack_unpack.c
# Opt level: O0

json_t * json_vpack_ex(json_error_t *error,size_t flags,char *fmt,__va_list_tag *ap)

{
  json_t *value;
  va_list ap_copy;
  undefined1 local_a8 [8];
  scanner_t s;
  __va_list_tag *ap_local;
  char *fmt_local;
  size_t flags_local;
  json_error_t *error_local;
  
  s.pos = (size_t)ap;
  if ((fmt == (char *)0x0) || (*fmt == '\0')) {
    jsonp_error_init(error,"<format>");
    jsonp_error_set(error,-1,-1,0,"NULL or empty format string");
    error_local = (json_error_t *)0x0;
  }
  else {
    jsonp_error_init(error,(char *)0x0);
    scanner_init((scanner_t *)local_a8,error,flags,fmt);
    next_token((scanner_t *)local_a8);
    ap_copy[0].overflow_arg_area = *(void **)(s.pos + 0x10);
    value = *(json_t **)s.pos;
    ap_copy[0]._0_8_ = *(undefined8 *)(s.pos + 8);
    error_local = (json_error_t *)pack((scanner_t *)local_a8,(va_list *)&value);
    if (error_local == (json_error_t *)0x0) {
      error_local = (json_error_t *)0x0;
    }
    else {
      next_token((scanner_t *)local_a8);
      if ((char)s.token.pos != '\0') {
        json_decref((json_t *)error_local);
        set_error((scanner_t *)local_a8,"<format>","Garbage after format string");
        error_local = (json_error_t *)0x0;
      }
    }
  }
  return (json_t *)error_local;
}

Assistant:

json_t *json_vpack_ex(json_error_t *error, size_t flags,
                      const char *fmt, va_list ap)
{
    scanner_t s;
    va_list ap_copy;
    json_t *value;

    if(!fmt || !*fmt) {
        jsonp_error_init(error, "<format>");
        jsonp_error_set(error, -1, -1, 0, "NULL or empty format string");
        return NULL;
    }
    jsonp_error_init(error, NULL);

    scanner_init(&s, error, flags, fmt);
    next_token(&s);

    va_copy(ap_copy, ap);
    value = pack(&s, &ap_copy);
    va_end(ap_copy);

    if(!value)
        return NULL;

    next_token(&s);
    if(token(&s)) {
        json_decref(value);
        set_error(&s, "<format>", "Garbage after format string");
        return NULL;
    }

    return value;
}